

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<float> * __thiscall
Fad<float>::operator=
          (Fad<float> *this,
          FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  float *pfVar4;
  ulong uVar5;
  value_type vVar6;
  value_type vVar7;
  value_type vVar8;
  
  uVar3 = FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>_>_>_>
          ::size(&fadexpr->fadexpr_);
  uVar1 = (this->dx_).num_elts;
  if (uVar3 != uVar1) {
    if (uVar3 == 0) {
      if (uVar1 != 0) {
        pfVar4 = (this->dx_).ptr_to_data;
        if (pfVar4 != (float *)0x0) {
          operator_delete__(pfVar4);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (float *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pfVar4 = (this->dx_).ptr_to_data;
        if (pfVar4 != (float *)0x0) {
          operator_delete__(pfVar4);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (float *)0x0;
      }
      (this->dx_).num_elts = uVar3;
      uVar5 = 0xffffffffffffffff;
      if (-1 < (int)uVar3) {
        uVar5 = (long)(int)uVar3 << 2;
      }
      pfVar4 = (float *)operator_new__(uVar5);
      (this->dx_).ptr_to_data = pfVar4;
    }
  }
  if (uVar3 != 0) {
    pfVar4 = (this->dx_).ptr_to_data;
    bVar2 = FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>_>_>_>
            ::hasFastAccess(&fadexpr->fadexpr_);
    if (bVar2) {
      if (0 < (int)uVar3) {
        uVar5 = 0;
        do {
          vVar6 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>
                  ::fastAccessDx(&((fadexpr->fadexpr_).left_)->fadexpr_,(int)uVar5);
          vVar7 = FadBinaryMul<Fad<float>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>_>
                  ::fastAccessDx(&((fadexpr->fadexpr_).right_)->fadexpr_,(int)uVar5);
          pfVar4[uVar5] = vVar7 + vVar6;
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
      }
    }
    else if (0 < (int)uVar3) {
      uVar5 = 0;
      do {
        vVar6 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>
                ::dx(&((fadexpr->fadexpr_).left_)->fadexpr_,(int)uVar5);
        vVar7 = FadBinaryMul<Fad<float>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>_>
                ::dx(&((fadexpr->fadexpr_).right_)->fadexpr_,(int)uVar5);
        pfVar4[uVar5] = vVar7 + vVar6;
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
  }
  vVar8 = FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>_>_>_>
          ::val(&fadexpr->fadexpr_);
  this->val_ = vVar8;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}